

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

uchar * ExportImageToMemory(Image image,char *fileType,int *dataSize)

{
  int iVar1;
  uchar *puVar2;
  int n;
  
  *dataSize = 0;
  if (image.data == (void *)0x0 || (image.height == 0 || image.width == 0)) {
    return (uchar *)0x0;
  }
  if (image.format - 1U < 7) {
    n = *(int *)(&DAT_00183720 + (ulong)(image.format - 1U) * 4);
  }
  else {
    n = 4;
  }
  iVar1 = strcmp(fileType,".png");
  if ((iVar1 != 0) && (iVar1 = strcmp(fileType,".PNG"), iVar1 != 0)) {
    return (uchar *)0x0;
  }
  puVar2 = stbi_write_png_to_mem
                     ((uchar *)image.data,n * image.width,image.width,image.height,n,dataSize);
  return puVar2;
}

Assistant:

unsigned char *ExportImageToMemory(Image image, const char *fileType, int *dataSize)
{
    unsigned char *fileData = NULL;
    *dataSize = 0;

    // Security check for input data
    if ((image.width == 0) || (image.height == 0) || (image.data == NULL)) return NULL;

#if defined(SUPPORT_IMAGE_EXPORT)
    int channels = 4;

    if (image.format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) channels = 1;
    else if (image.format == PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA) channels = 2;
    else if (image.format == PIXELFORMAT_UNCOMPRESSED_R8G8B8) channels = 3;
    else if (image.format == PIXELFORMAT_UNCOMPRESSED_R8G8B8A8) channels = 4;

#if defined(SUPPORT_FILEFORMAT_PNG)
    if ((strcmp(fileType, ".png") == 0) || (strcmp(fileType, ".PNG") == 0))
    {
        fileData = stbi_write_png_to_mem((const unsigned char *)image.data, image.width*channels, image.width, image.height, channels, dataSize);
    }
#endif

#endif

    return fileData;
}